

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger base_array(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectPtr *pSVar2;
  SQInteger SVar3;
  SQObjectValue this;
  SQObjectPtr local_30;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase + 1);
  SVar3 = sq_gettop(v);
  ss = v->_sharedstate;
  if (SVar3 < 3) {
    if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
      SVar3 = (SQInteger)(pSVar2->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar3 = (pSVar2->super_SQObject)._unVal.nInteger;
    }
    this.pUserPointer = sq_vm_malloc(0x48);
    SQArray::SQArray(this.pArray,ss,SVar3);
  }
  else {
    this.pUserPointer = sq_vm_malloc(0x48);
    SQArray::SQArray(this.pArray,ss,0);
    if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
      SVar3 = (SQInteger)(pSVar2->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar3 = (pSVar2->super_SQObject)._unVal.nInteger;
    }
    pSVar2 = SQVM::GetAt(v,v->_stackbase + 2);
    SQArray::Resize(this.pArray,SVar3,pSVar2);
  }
  local_30.super_SQObject._type = OT_ARRAY;
  pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_30.super_SQObject._unVal = this;
  SQVM::Push(v,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return 1;
}

Assistant:

static SQInteger base_array(HSQUIRRELVM v)
{
    SQArray *a;
    SQObject &size = stack_get(v,2);
    if(sq_gettop(v) > 2) {
        a = SQArray::Create(_ss(v),0);
        a->Resize(tointeger(size),stack_get(v,3));
    }
    else {
        a = SQArray::Create(_ss(v),tointeger(size));
    }
    v->Push(a);
    return 1;
}